

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O2

bool __thiscall
miniros::RPCManager::bindEx(RPCManager *this,string *function_name,XMLRPCFuncEx *cb,void *object)

{
  _Rb_tree_header *p_Var1;
  iterator iVar2;
  XMLRPCCallWrapperEx *this_00;
  mapped_type *this_01;
  FunctionInfo info;
  
  std::mutex::lock(&this->functions_mutex_);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>_>
          ::find(&(this->functions_)._M_t,function_name);
  p_Var1 = &(this->functions_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar2._M_node == p_Var1) {
    info.name._M_dataplus._M_p = (pointer)&info.name.field_2;
    info.name._M_string_length = 0;
    info.name.field_2._M_local_buf[0] = '\0';
    info.function.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    info.function.super__Function_base._M_functor._8_8_ = 0;
    info.function.super__Function_base._M_manager = (_Manager_type)0x0;
    info.function._M_invoker = (_Invoker_type)0x0;
    info.functionEx.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    info.functionEx.super__Function_base._M_functor._8_8_ = 0;
    info.functionEx.super__Function_base._M_manager = (_Manager_type)0x0;
    info.functionEx._M_invoker = (_Invoker_type)0x0;
    info.object = (void *)0x0;
    info.wrapper.super___shared_ptr<XmlRpc::XmlRpcServerMethod,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    info.wrapper.super___shared_ptr<XmlRpc::XmlRpcServerMethod,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__cxx11::string::_M_assign((string *)&info);
    std::
    function<int_(const_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcServerConnection_*)>
    ::operator=(&info.functionEx,cb);
    this_00 = (XMLRPCCallWrapperEx *)operator_new(0x50);
    XMLRPCCallWrapperEx::XMLRPCCallWrapperEx(this_00,function_name,cb,&this->server_);
    std::__shared_ptr<XmlRpc::XmlRpcServerMethod,_(__gnu_cxx::_Lock_policy)2>::
    reset<miniros::XMLRPCCallWrapperEx>
              (&info.wrapper.
                super___shared_ptr<XmlRpc::XmlRpcServerMethod,_(__gnu_cxx::_Lock_policy)2>,this_00);
    info.object = object;
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>_>
              ::operator[](&this->functions_,function_name);
    FunctionInfo::operator=(this_01,&info);
    FunctionInfo::~FunctionInfo(&info);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->functions_mutex_);
  return (_Rb_tree_header *)iVar2._M_node == p_Var1;
}

Assistant:

bool RPCManager::bindEx(const std::string& function_name, const XMLRPCFuncEx& cb, void* object)
{
  std::scoped_lock<std::mutex> lock(functions_mutex_);
  if (functions_.find(function_name) != functions_.end())
  {
    return false;
  }

  FunctionInfo info;
  info.name = function_name;
  info.functionEx = cb;
  info.wrapper.reset(new XMLRPCCallWrapperEx(function_name, cb, &server_));
  info.object = object;
  functions_[function_name] = info;

  return true;
}